

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

void make_edges(chunk_conflict *c,_Bool ragged,_Bool valley)

{
  uint uVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t *pwVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  loc lVar11;
  loc lVar12;
  loc lVar13;
  ulong uVar14;
  bool bVar15;
  uint local_44;
  wchar_t path_x [3];
  
  uVar3 = Rand_div(2);
  uVar8 = uVar3 + 2;
  uVar7 = 0;
  uVar14 = 0;
  if (0 < (int)uVar8) {
    uVar14 = (ulong)uVar8;
  }
  for (; uVar14 != uVar7; uVar7 = uVar7 + 1) {
    uVar3 = Rand_div((c->width + -0x14) / (int)uVar8 - 2);
    path_x[uVar7] = ((int)uVar7 * (c->width + -0x14)) / (int)uVar8 + uVar3 + L'\n';
  }
  uVar5 = (uint)valley * 3 + 7;
  local_44 = valley | 4;
  lVar11.x = L'\0';
  lVar11.y = L'\0';
  uVar6 = local_44;
  for (; uVar7 = (ulong)c->width, (long)lVar11 < (long)uVar7; lVar11 = (loc)((long)lVar11 + 1)) {
    if (ragged) {
      uVar3 = Rand_div(3);
      uVar6 = (uVar6 - uVar3) + 1;
      if ((int)uVar5 <= (int)uVar6) {
        uVar6 = uVar5;
      }
      if ((int)uVar6 < 2) {
        uVar6 = 1;
      }
      for (uVar7 = 0; (ulong)uVar6 << 0x20 != uVar7; uVar7 = uVar7 + 0x100000000) {
        _Var2 = square_ismark(c,(loc)((long)lVar11 + uVar7));
        if (!_Var2) {
          square_set_feat(c,(loc)((long)lVar11 + uVar7),FEAT_PERM);
        }
      }
      if ((lVar11 != (loc)0x0 && valley) &&
         (lVar13.y = L'\0', lVar13.x = player->upkeep->path_coord, lVar11 == lVar13)) {
        lVar13 = (loc)((ulong)uVar6 << 0x20 | (ulong)lVar11);
        square_set_feat(c,lVar13,FEAT_PASS_RUBBLE);
        player_place((chunk_conflict2 *)c,player,lVar13);
      }
    }
    else {
      square_set_feat(c,lVar11,FEAT_PERM);
    }
  }
  iVar9 = 0;
  for (uVar14 = 0; (long)uVar14 < (long)(int)uVar7; uVar14 = uVar14 + 1) {
    if ((!ragged) || ((uVar6 = 7, valley && (uVar6 = 10, player->depth == 0x46)))) {
      square_set_feat(c,(loc)((ulong)(c->height - 1) << 0x20 | uVar14),FEAT_PERM);
    }
    else {
      uVar3 = Rand_div(3);
      local_44 = (local_44 - uVar3) + 1;
      if ((int)uVar6 <= (int)local_44) {
        local_44 = uVar6;
      }
      if ((int)local_44 < 2) {
        local_44 = 1;
      }
      uVar6 = c->height;
      uVar5 = uVar6;
      while( true ) {
        uVar1 = uVar5 - 1;
        if ((int)uVar1 <= (int)(uVar6 + ~local_44)) break;
        lVar11 = (loc)((ulong)uVar1 << 0x20 | uVar14);
        _Var2 = square_ismark(c,lVar11);
        if (!_Var2) {
          if ((!valley) || (pwVar4 = &FEAT_VOID, uVar5 == c->height)) {
            pwVar4 = &FEAT_PERM;
          }
          square_set_feat(c,lVar11,*pwVar4);
        }
        uVar6 = c->height;
        uVar5 = uVar1;
      }
      if ((iVar9 < (int)uVar8 && valley) && (uVar14 == (uint)path_x[iVar9])) {
        lVar11 = (loc)((ulong)uVar1 << 0x20 | uVar14);
        square_set_feat(c,lVar11,FEAT_MORE_SOUTH);
        square_mark(c,lVar11);
        iVar9 = iVar9 + 1;
      }
    }
    uVar7 = (ulong)(uint)c->width;
  }
  uVar7 = 5;
  lVar12.x = L'\0';
  lVar12.y = L'\0';
  for (lVar10 = 0; uVar14 = (ulong)c->height, lVar10 < (long)uVar14; lVar10 = lVar10 + 1) {
    if (ragged) {
      uVar3 = Rand_div(3);
      uVar8 = ((int)uVar7 - uVar3) + 1;
      if (9 < (int)uVar8) {
        uVar8 = 10;
      }
      uVar14 = (ulong)uVar8;
      lVar11 = lVar12;
      uVar7 = uVar14;
      if ((int)uVar8 < 2) {
        uVar14 = 1;
        uVar7 = uVar14;
      }
      while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
        _Var2 = square_ismark(c,lVar11);
        if (!_Var2) {
          square_set_feat(c,lVar11,FEAT_PERM);
        }
        lVar11 = (loc)((long)lVar11 + 1);
      }
    }
    else {
      square_set_feat(c,(loc)(lVar10 << 0x20),FEAT_PERM);
    }
    lVar12 = (loc)((long)lVar12 + 0x100000000);
  }
  uVar8 = 5;
  for (lVar10 = 0; lVar10 < (int)uVar14; lVar10 = lVar10 + 1) {
    if (ragged) {
      uVar3 = Rand_div(3);
      uVar8 = (uVar8 - uVar3) + 1;
      if (9 < (int)uVar8) {
        uVar8 = 10;
      }
      if ((int)uVar8 < 2) {
        uVar8 = 1;
      }
      uVar6 = c->width;
      uVar5 = uVar6;
      while( true ) {
        uVar5 = uVar5 - 1;
        if ((int)uVar5 <= (int)(uVar6 + ~uVar8)) break;
        lVar11 = (loc)((ulong)uVar5 | lVar10 << 0x20);
        _Var2 = square_ismark(c,lVar11);
        if (!_Var2) {
          square_set_feat(c,lVar11,FEAT_PERM);
        }
        uVar6 = c->width;
      }
    }
    else {
      square_set_feat(c,(loc)((ulong)(c->width - 1) | lVar10 << 0x20),FEAT_PERM);
    }
    uVar14 = (ulong)(uint)c->height;
  }
  return;
}

Assistant:

static void make_edges(struct chunk *c, bool ragged, bool valley)
{
	int i, j, num = 2;
	int path_x[3];
	struct loc grid;

	/* Prepare places for down slides */
	num += randint0(2);
	for (i = 0; i < num; i++)
		/*
		 * Skip first and last ten columns to avoid surrounding the
		 * slide in permanent walls.  Avoid last two columns in each
		 * interval to limit the possibility of nearby slides.
		 */
		path_x[i] = 10 + randint0((c->width - 20) / num - 2)
			+ (i * (c->width - 20)) / num;

	/* Special boundary walls -- Top */
	i = (valley ? 5 : 4);
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = 0; grid.y < i; grid.y++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
			if (valley && (grid.x > 0) &&
				(grid.x == player->upkeep->path_coord)) {
				if (grid.y == 0) {
					grid.y++;
				}
				square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				player_place(c, player, grid);
			}
		} else {
			grid.y = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}


	/* Special boundary walls -- Bottom */
	i = (valley ? 5 : 4);
	j = 0;
	for (grid.x = 0; grid.x < c->width; grid.x++) {
		if (ragged && !(valley && (player->depth == 70))) {
			i += 1 - randint0(3);
			if (i > (valley ? 10 : 7))
				i = (valley ? 10 : 7);
			if (i < 1)
				i = 1;
			for (grid.y = c->height - 1; grid.y > c->height - 1 - i; grid.y--) {
				/* Clear previous contents, add perma-wall or void */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, (valley && grid.y != c->height - 1) ? FEAT_VOID : FEAT_PERM);
				}
			}
			/* Down slides */
			if ((j < num) && valley)
				if (grid.x == path_x[j]) {
					square_set_feat(c, grid, FEAT_MORE_SOUTH);
					/* Mark so it won't be overwritten. */
					square_mark(c, grid);
					j++;
				}
		} else {
			grid.y = c->height - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Left */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = 0; grid.x < i; grid.x++) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = 0;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}

	/* Special boundary walls -- Right */
	i = 5;
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		if (ragged) {
			i += 1 - randint0(3);
			if (i > 10)
				i = 10;
			if (i < 1)
				i = 1;
			for (grid.x = c->width - 1; grid.x > c->width - 1 - i; grid.x--) {
				/* Clear previous contents, add perma-wall */
				if (!square_ismark(c, grid)) {
					square_set_feat(c, grid, FEAT_PERM);
				}
			}
		} else {
			grid.x = c->width - 1;

			/* Clear previous contents, add perma-wall */
			square_set_feat(c, grid, FEAT_PERM);
		}
	}
}